

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

void __thiscall LinearSystem::LinearSystem(LinearSystem *this,ExtendedMatrix *system,Mode mode)

{
  int iVar1;
  Matrix *pMVar2;
  
  this->mode_ = mode;
  pMVar2 = ExtendedMatrix::GetMainMatrix(system);
  iVar1 = Matrix::GetNumRows(pMVar2);
  this->n_ = iVar1;
  pMVar2 = ExtendedMatrix::GetMainMatrix(system);
  iVar1 = Matrix::GetNumColumns(pMVar2);
  this->m_ = iVar1;
  this->rank_ = -1;
  ExtendedMatrix::ExtendedMatrix(&this->start_system_,system);
  ExtendedMatrix::ExtendedMatrix(&this->system_,system);
  (this->history_).
  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->history_).
  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->history_).
  super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

LinearSystem::LinearSystem(const ExtendedMatrix& system, Mode mode)
    : mode_(mode),
      n_(system.GetMainMatrix().GetNumRows()),
      m_(system.GetMainMatrix().GetNumColumns()),
      rank_(-1),
      start_system_(system),
      system_(system),
      history_() {}